

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O1

S1Interval __thiscall S1Interval::Expanded(S1Interval *this,double margin)

{
  Vector2_d VVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  S1Interval result;
  S1Interval local_48;
  double local_38;
  undefined8 uStack_30;
  double local_20;
  S2LogMessage local_18;
  
  dVar4 = (this->bounds_).c_[0];
  dVar3 = (this->bounds_).c_[1];
  if (0.0 <= margin) {
    if ((((dVar4 == 3.141592653589793) && (!NAN(dVar4))) && (dVar3 == -3.141592653589793)) &&
       (!NAN(dVar3))) goto LAB_0019e983;
    dVar3 = dVar3 - dVar4;
    if (dVar3 < 0.0) {
      uVar2 = -(ulong)(0.0 < dVar3 + 6.283185307179586);
      dVar3 = (double)((ulong)(dVar3 + 6.283185307179586) & uVar2 | ~uVar2 & 0xbff0000000000000);
    }
    if (6.283185307179586 <= margin + margin + dVar3 + 4.440892098500626e-16) {
      local_48.bounds_.c_[0] = -3.141592653589793;
      local_48.bounds_.c_[1] = 3.141592653589793;
      goto LAB_0019eade;
    }
  }
  else {
    if (((dVar4 == -3.141592653589793) && (!NAN(dVar4))) &&
       ((dVar3 == 3.141592653589793 && (!NAN(dVar3))))) {
LAB_0019e983:
      local_48.bounds_.c_[0] = (this->bounds_).c_[0];
      local_48.bounds_.c_[1] = (this->bounds_).c_[1];
      goto LAB_0019eade;
    }
    dVar3 = dVar3 - dVar4;
    if (dVar3 < 0.0) {
      uVar2 = -(ulong)(0.0 < dVar3 + 6.283185307179586);
      dVar3 = (double)((ulong)(dVar3 + 6.283185307179586) & uVar2 | ~uVar2 & 0xbff0000000000000);
    }
    if (margin + margin + dVar3 + -4.440892098500626e-16 <= 0.0) {
      local_48.bounds_.c_[0] = 3.141592653589793;
      local_48.bounds_.c_[1] = -3.141592653589793;
      goto LAB_0019eade;
    }
  }
  local_20 = margin;
  local_38 = remainder((this->bounds_).c_[0] - margin,6.283185307179586);
  dVar4 = remainder(local_20 + (this->bounds_).c_[1],6.283185307179586);
  S1Interval(&local_48,local_38,dVar4);
  if (local_48.bounds_.c_[0] <= -3.141592653589793) {
    local_48.bounds_.c_[0] = 3.141592653589793;
    local_38 = ABS(local_48.bounds_.c_[1]);
    if (3.141592653589793 < local_38) {
      uStack_30 = 0;
      S2LogMessage::S2LogMessage
                (&local_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                 ,0xfe,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_18.stream_,"Check failed: is_valid() ",0x19);
      if (3.141592653589793 < local_38) {
        abort();
      }
    }
  }
LAB_0019eade:
  VVar1.c_[1] = local_48.bounds_.c_[1];
  VVar1.c_[0] = local_48.bounds_.c_[0];
  return (Vector2_d)(Vector2_d)VVar1.c_;
}

Assistant:

S1Interval S1Interval::Expanded(double margin) const {
  if (margin >= 0) {
    if (is_empty()) return *this;
    // Check whether this interval will be full after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin + 2 * DBL_EPSILON >= 2 * M_PI) return Full();
  } else {
    if (is_full()) return *this;
    // Check whether this interval will be empty after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin - 2 * DBL_EPSILON <= 0) return Empty();
  }
  S1Interval result(remainder(lo() - margin, 2*M_PI),
                    remainder(hi() + margin, 2*M_PI));
  if (result.lo() <= -M_PI) result.set_lo(M_PI);
  return result;
}